

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int bbSPIClose(uint CS)

{
  int iVar1;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  uint in_EDI;
  int SCLK;
  int local_4;
  
  pFVar2 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar4 = myTimeStamp();
    fprintf(pFVar2,"%s %s: CS=%d\n",pcVar4,"bbSPIClose",(ulong)in_EDI);
  }
  pFVar2 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar4 = myTimeStamp();
      fprintf(pFVar2,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar4,"bbSPIClose");
    }
    local_4 = -0x1f;
  }
  else if (in_EDI < 0x20) {
    if (wfRx[in_EDI].mode == 7) {
      myGpioSetMode(wfRx[in_EDI].field_4.I.SDA,wfRx[in_EDI].field_4.s.nextBitDiff);
      wfRx[in_EDI].mode = 0;
      iVar1 = wfRx[in_EDI].field_4.s.readPos;
      iVar3 = wfRx[iVar1].field_4.s.writePos + -1;
      wfRx[iVar1].field_4.s.writePos = iVar3;
      if (iVar3 < 1) {
        myGpioSetMode(wfRx[iVar1].field_4.I.SCL,wfRx[iVar1].field_4.s.timeout);
        myGpioSetMode(wfRx[iVar1].field_4.s.bufSize,wfRx[iVar1].field_4.s.startBitTick);
        myGpioSetMode(wfRx[iVar1].field_4.s.readPos,wfRx[iVar1].field_4.s.bit);
        wfRx[wfRx[iVar1].field_4.I.SCL].mode = 0;
        wfRx[wfRx[iVar1].field_4.I.delay].mode = 0;
        wfRx[wfRx[iVar1].field_4.s.readPos].mode = 0;
      }
      local_4 = 0;
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar4 = myTimeStamp();
        fprintf(pFVar2,"%s %s: no SPI on gpio (%d)\n",pcVar4,"bbSPIClose",(ulong)in_EDI);
      }
      local_4 = -0x8e;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar4 = myTimeStamp();
      fprintf(pFVar2,"%s %s: bad gpio (%d)\n",pcVar4,"bbSPIClose",(ulong)in_EDI);
    }
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int bbSPIClose(unsigned CS)
{
   int SCLK;

   DBG(DBG_USER, "CS=%d", CS);

   CHECK_INITED;

   if (CS > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", CS);

   switch(wfRx[CS].mode)
   {
      case PI_WFRX_SPI_CS:

         myGpioSetMode(wfRx[CS].S.CS, wfRx[CS].S.CSMode);
         wfRx[CS].mode = PI_WFRX_NONE;

         SCLK = wfRx[CS].S.SCLK;

         if (--wfRx[SCLK].S.usage <= 0)
         {
            myGpioSetMode(wfRx[SCLK].S.MISO, wfRx[SCLK].S.MISOMode);
            myGpioSetMode(wfRx[SCLK].S.MOSI, wfRx[SCLK].S.MOSIMode);
            myGpioSetMode(wfRx[SCLK].S.SCLK, wfRx[SCLK].S.SCLKMode);

            wfRx[wfRx[SCLK].S.MISO].mode = PI_WFRX_NONE;
            wfRx[wfRx[SCLK].S.MOSI].mode = PI_WFRX_NONE;
            wfRx[wfRx[SCLK].S.SCLK].mode = PI_WFRX_NONE;
         }

         break;

      default:

         SOFT_ERROR(PI_NOT_SPI_GPIO, "no SPI on gpio (%d)", CS);

         break;

   }

   return 0;
}